

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bitileave.cpp
# Opt level: O1

void __thiscall
bitmanip::anon_unknown_0::Test_bitileave_ileaveBytes_dileaveBytes_random_::run
          (Test_bitileave_ileaveBytes_dileaveBytes_random_ *this)

{
  string_view msg;
  SourceLocation loc;
  uint64_t bytes;
  char *pcVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  char *bytes_00;
  long lVar5;
  char cVar6;
  ulong count;
  ulong uVar7;
  uint64_t bytesAsInt;
  uint64_t dileaved;
  size_t in_stack_fffffffffffffee0;
  _Alloc_hider _Var8;
  unsigned_long uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  char *local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar7 = 0x3039;
  lVar5 = 0x4000;
  cVar6 = '\0';
  uVar4 = 0;
  while( true ) {
    uVar7 = uVar7 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
    count = uVar4 % 9;
    bytes_00 = (char *)0x0;
    if (count != 0) {
      bytes_00 = (char *)(uVar7 >> (cVar6 + (char)(uVar4 / 9) * 'H' & 0x3fU));
    }
    bytes = detail::ileaveBytes_jmp((uint64_t)bytes_00,count);
    pcVar1 = (char *)detail::dileaveBytes_jmp(bytes,count);
    if (pcVar1 != bytes_00) break;
    uVar4 = uVar4 + 1;
    cVar6 = cVar6 + -8;
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      return;
    }
  }
  detail::stringify_impl<unsigned_long>(&local_90,(unsigned_long *)&stack0xffffffffffffff10);
  std::operator+(&local_70,"Comparison failed: dileaved == bytesAsInt (with \"dileaved\"=",&local_90
                );
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  _Var8._M_p = (pointer)*plVar2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var8._M_p == paVar3) {
    local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_d8._8_8_ = plVar2[3];
    _Var8._M_p = (pointer)&local_d8;
  }
  else {
    local_d8._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  uVar9 = plVar2[1];
  *plVar2 = (long)paVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  detail::stringify_impl<unsigned_long>(&local_b0,(unsigned_long *)&stack0xfffffffffffffee8);
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff18,&local_b0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  *plVar2 = (long)(plVar2 + 2);
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/Eisenwave[P]bitmanip/test/test_bitileave.cpp";
  pcStack_c0 = "run";
  local_b8 = 0xf8;
  msg._M_str = bytes_00;
  msg._M_len = in_stack_fffffffffffffee0;
  loc.function = _Var8._M_p;
  loc.file = pcVar1;
  loc.line = uVar9;
  assertFail(msg,loc);
}

Assistant:

BITMANIP_TEST(bitileave, ileaveBytes_dileaveBytes_random)
{
    constexpr size_t iterations = 1024 * 16;

    fast_rng64 rng{12345};
    std::uniform_int_distribution<std::uint64_t> distr;

    for (size_t i = 0; i < iterations; ++i) {
        std::uint8_t count = i % 9;
        std::uint64_t next = distr(rng);
        std::uint64_t bytesAsInt = count == 0 ? 0 : next >> ((8 - count) * 8);

        std::uint64_t ileaved = ileaveBytes(bytesAsInt, count);
        std::uint64_t dileaved = dileave_bytes(ileaved, count);

        BITMANIP_ASSERT_EQ(dileaved, bytesAsInt);
    }
}